

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O2

void Assimp::IFC::ProcessPolyLine(IfcPolyline *def,TempMesh *meshout,ConversionData *param_3)

{
  Lazy *pLVar1;
  IfcCartesianPoint *in;
  Lazy *this;
  uint local_3c;
  IfcVector3 t;
  
  t.z = 0.0;
  t.x = 0.0;
  t.y = 0.0;
  pLVar1 = *(Lazy **)&def->field_0x58;
  for (this = *(Lazy **)&(def->super_IfcBoundedCurve).field_0x50; this != pLVar1; this = this + 8) {
    in = STEP::Lazy::operator_cast_to_IfcCartesianPoint_(this);
    ConvertCartesianPoint(&t,in);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              (&meshout->mVerts,&t);
  }
  local_3c = (uint)(((long)(meshout->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(meshout->mVerts).
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&meshout->mVertcnt,&local_3c);
  return;
}

Assistant:

void ProcessPolyLine(const Schema_2x3::IfcPolyline& def, TempMesh& meshout, ConversionData& /*conv*/)
{
    // this won't produce a valid mesh, it just spits out a list of vertices
    IfcVector3 t;
    for(const Schema_2x3::IfcCartesianPoint& cp : def.Points) {
        ConvertCartesianPoint(t,cp);
        meshout.mVerts.push_back(t);
    }
    meshout.mVertcnt.push_back(static_cast<unsigned int>(meshout.mVerts.size()));
}